

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

char * google::itoa_r(uintptr_t i,char *buf,size_t sz,uint base,size_t padding)

{
  char cVar1;
  char *pcVar2;
  bool local_52;
  char *pcStack_50;
  char ch;
  char *ptr;
  char *start;
  size_t n;
  size_t padding_local;
  uint base_local;
  size_t sz_local;
  char *buf_local;
  uintptr_t i_local;
  
  start = (char *)0x1;
  if (sz == 0) {
    i_local = 0;
  }
  else if ((base < 2) || (pcStack_50 = buf, n = padding, buf_local = (char *)i, 0x10 < base)) {
    *buf = '\0';
    i_local = 0;
  }
  else {
    do {
      start = start + 1;
      if (sz < start) {
        *buf = '\0';
        return (char *)0x0;
      }
      pcVar2 = pcStack_50 + 1;
      *pcStack_50 = "0123456789abcdef"[(ulong)buf_local % (ulong)base];
      buf_local = (char *)((ulong)buf_local / (ulong)base);
      if (n != 0) {
        n = n - 1;
      }
      local_52 = buf_local != (char *)0x0 || n != 0;
      pcStack_50 = pcVar2;
    } while (local_52);
    *pcVar2 = '\0';
    ptr = buf;
    while (pcStack_50 = pcStack_50 + -1, i_local = (uintptr_t)buf, ptr < pcStack_50) {
      cVar1 = *pcStack_50;
      *pcStack_50 = *ptr;
      *ptr = cVar1;
      ptr = ptr + 1;
    }
  }
  return (char *)i_local;
}

Assistant:

static char* itoa_r(uintptr_t i, char* buf, size_t sz, unsigned base,
                    size_t padding) {
  // Make sure we can write at least one NUL byte.
  size_t n = 1;
  if (n > sz) {
    return nullptr;
  }

  if (base < 2 || base > 16) {
    buf[0] = '\000';
    return nullptr;
  }

  char* start = buf;

  // Loop until we have converted the entire number. Output at least one
  // character (i.e. '0').
  char* ptr = start;
  do {
    // Make sure there is still enough space left in our output buffer.
    if (++n > sz) {
      buf[0] = '\000';
      return nullptr;
    }

    // Output the next digit.
    *ptr++ = "0123456789abcdef"[i % base];
    i /= base;

    if (padding > 0) {
      padding--;
    }
  } while (i > 0 || padding > 0);

  // Terminate the output with a NUL character.
  *ptr = '\000';

  // Conversion to ASCII actually resulted in the digits being in reverse
  // order. We can't easily generate them in forward order, as we can't tell
  // the number of characters needed until we are done converting.
  // So, now, we reverse the string (except for the possible "-" sign).
  while (--ptr > start) {
    char ch = *ptr;
    *ptr = *start;
    *start++ = ch;
  }
  return buf;
}